

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_gej *prej,secp256k1_fe *zr,secp256k1_gej *a)

{
  long in_RCX;
  void *in_RDX;
  void *in_RSI;
  int in_EDI;
  int i;
  secp256k1_ge d_ge;
  secp256k1_ge a_ge;
  secp256k1_gej d;
  undefined4 in_stack_fffffffffffffea8;
  int iVar1;
  secp256k1_fe *in_stack_fffffffffffffeb0;
  undefined1 auStack_128 [24];
  secp256k1_fe *in_stack_fffffffffffffef0;
  secp256k1_gej *in_stack_fffffffffffffef8;
  uint in_stack_ffffffffffffff04;
  undefined1 local_f8 [40];
  undefined1 auStack_d0 [16];
  secp256k1_fe *in_stack_ffffffffffffff40;
  secp256k1_gej *in_stack_ffffffffffffff48;
  secp256k1_gej *in_stack_ffffffffffffff50;
  undefined1 local_a0 [40];
  undefined1 auStack_78 [40];
  undefined1 auStack_50 [48];
  long local_20;
  void *local_18;
  void *local_10;
  int local_4;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  secp256k1_gej_double_var
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  memcpy(&stack0xfffffffffffffeb0,local_a0,0x28);
  memcpy(auStack_128,auStack_78,0x28);
  secp256k1_ge_set_gej_zinv
            ((secp256k1_ge *)((ulong)in_stack_ffffffffffffff04 << 0x20),in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  memcpy(local_10,local_f8,0x28);
  memcpy((void *)((long)local_10 + 0x28),auStack_d0,0x28);
  memcpy((void *)((long)local_10 + 0x50),(void *)(local_20 + 0x50),0x28);
  *(undefined4 *)((long)local_10 + 0x78) = 0;
  memcpy(local_18,auStack_50,0x28);
  for (iVar1 = 1; iVar1 < local_4; iVar1 = iVar1 + 1) {
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)a_ge.x.n[2],(secp256k1_gej *)a_ge.x.n[1],(secp256k1_ge *)a_ge.x.n[0]
               ,(secp256k1_fe *)d_ge._80_8_);
  }
  secp256k1_fe_mul(in_stack_fffffffffffffeb0,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffea8),
                   (secp256k1_fe *)0x121e7b);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_gej *prej, secp256k1_fe *zr, const secp256k1_gej *a) {
    secp256k1_gej d;
    secp256k1_ge a_ge, d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions on an isomorphism where 'd' is affine: drop the z coordinate
     * of 'd', and scale the 1P starting value's x/y coordinates without changing its z.
     */
    d_ge.x = d.x;
    d_ge.y = d.y;
    d_ge.infinity = 0;

    secp256k1_ge_set_gej_zinv(&a_ge, a, &d.z);
    prej[0].x = a_ge.x;
    prej[0].y = a_ge.y;
    prej[0].z = a->z;
    prej[0].infinity = 0;

    zr[0] = d.z;
    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&prej[i], &prej[i-1], &d_ge, &zr[i]);
    }

    /*
     * Each point in 'prej' has a z coordinate too small by a factor of 'd.z'. Only
     * the final point's z coordinate is actually used though, so just update that.
     */
    secp256k1_fe_mul(&prej[n-1].z, &prej[n-1].z, &d.z);
}